

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.h
# Opt level: O0

void __thiscall ExttposeArgument::parse_args(ExttposeArgument *this,int argc,char **argv)

{
  initializer_list<const_char_*const> init_list;
  bool bVar1;
  byte bVar2;
  runtime_error *prVar3;
  string local_13c8 [32];
  long local_13a8;
  ifstream inconff;
  allocator local_1199;
  string local_1198 [39];
  allocator local_1171;
  string local_1170 [32];
  string_stream local_1150;
  allocator local_fc9;
  string local_fc8 [32];
  string_stream local_fa8;
  allocator local_e21;
  string local_e20 [39];
  allocator local_df9;
  string local_df8 [39];
  allocator local_dd1;
  string local_dd0 [39];
  allocator local_da9;
  string local_da8 [39];
  allocator local_d81;
  string local_d80 [32];
  string_stream local_d60;
  allocator local_bd9;
  string local_bd8 [32];
  string_stream local_bb8;
  allocator local_a31;
  string local_a30 [32];
  string_stream local_a10;
  allocator local_889;
  string local_888 [32];
  string_stream local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668 [39];
  allocator local_641;
  string local_640 [32];
  string_stream local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480 [39];
  allocator local_459;
  string local_458 [32];
  string_stream local_438;
  char *local_2a8;
  char *pcStack_2a0;
  char *local_298;
  iterator local_290;
  undefined8 local_288;
  string_stream local_280;
  undefined1 local_100 [8];
  parser cmdl;
  char **argv_local;
  int argc_local;
  ExttposeArgument *this_local;
  
  cmdl._216_8_ = argv;
  argh::parser::parser((parser *)local_100,argc,argv,2);
  local_298 = "o";
  local_2a8 = "s";
  pcStack_2a0 = "i";
  local_290 = &local_2a8;
  local_288 = 3;
  init_list._M_len = 3;
  init_list._M_array = local_290;
  argh::parser::operator()(&local_280,(parser *)local_100,init_list);
  bVar1 = argh::stringstream_proxy::operator_cast_to_bool(&local_280);
  argh::stringstream_proxy::~stringstream_proxy(&local_280);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::operator<<((ostream *)&std::cerr,"usage: exttpose [OPTION]... -i<infile> -o<outfile> -s\n")
    ;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"exttpose needs valid value of -i -o and -s");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"i",&local_459);
  argh::parser::operator()(&local_438,(parser *)local_100,(string *)local_458);
  argh::stringstream_proxy::operator>>(&local_438,&this->name);
  argh::stringstream_proxy::~stringstream_proxy(&local_438);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::operator+(local_480,(char *)&this->name);
  std::__cxx11::string::operator=((string *)this,(string *)local_480);
  std::__cxx11::string::~string((string *)local_480);
  std::operator+(local_4a0,(char *)&this->name);
  std::__cxx11::string::operator=((string *)&this->inconfn,(string *)local_4a0);
  std::__cxx11::string::~string((string *)local_4a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_640,"o",&local_641);
  argh::parser::operator()(&local_620,(parser *)local_100,(string *)local_640);
  argh::stringstream_proxy::operator>>(&local_620,&this->name);
  argh::stringstream_proxy::~stringstream_proxy(&local_620);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  std::operator+(local_668,(char *)&this->name);
  std::__cxx11::string::operator=((string *)&this->output,(string *)local_668);
  std::__cxx11::string::~string((string *)local_668);
  std::operator+(local_688,(char *)&this->name);
  std::__cxx11::string::operator=((string *)&this->idxfn,(string *)local_688);
  std::__cxx11::string::~string((string *)local_688);
  std::operator+(local_6a8,(char *)&this->name);
  std::__cxx11::string::operator=((string *)&this->it2fn,(string *)local_6a8);
  std::__cxx11::string::~string((string *)local_6a8);
  std::operator+(local_6c8,(char *)&this->name);
  std::__cxx11::string::operator=((string *)&this->seqfn,(string *)local_6c8);
  std::__cxx11::string::~string((string *)local_6c8);
  std::operator+(local_6e8,(char *)&this->name);
  std::__cxx11::string::operator=((string *)&this->tmpfn,(string *)local_6e8);
  std::__cxx11::string::~string((string *)local_6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_888,"p",&local_889);
  argh::parser::operator()(&local_868,(parser *)local_100,(string *)local_888);
  argh::stringstream_proxy::operator>>(&local_868,&this->num_partitions);
  argh::stringstream_proxy::~stringstream_proxy(&local_868);
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator((allocator<char> *)&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a30,"s",&local_a31);
  argh::parser::operator()(&local_a10,(parser *)local_100,(string *)local_a30);
  argh::stringstream_proxy::operator>>(&local_a10,&this->MINSUP_PER);
  argh::stringstream_proxy::~stringstream_proxy(&local_a10);
  std::__cxx11::string::~string(local_a30);
  std::allocator<char>::~allocator((allocator<char> *)&local_a31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bd8,"a",&local_bd9);
  argh::parser::operator()(&local_bb8,(parser *)local_100,(string *)local_bd8);
  bVar1 = argh::stringstream_proxy::operator_cast_to_bool(&local_bb8);
  argh::stringstream_proxy::~stringstream_proxy(&local_bb8);
  std::__cxx11::string::~string(local_bd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
  if (bVar1) {
    this->use_seq = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d80,"a",&local_d81);
    argh::parser::operator()(&local_d60,(parser *)local_100,(string *)local_d80);
    argh::stringstream_proxy::operator>>(&local_d60,&this->write_only_fcnt);
    argh::stringstream_proxy::~stringstream_proxy(&local_d60);
    std::__cxx11::string::~string(local_d80);
    std::allocator<char>::~allocator((allocator<char> *)&local_d81);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_da8,"d",&local_da9);
  bVar1 = argh::parser::operator[]((parser *)local_100,(string *)local_da8);
  std::__cxx11::string::~string(local_da8);
  std::allocator<char>::~allocator((allocator<char> *)&local_da9);
  if (bVar1) {
    this->use_diff = '\x01';
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dd0,"l",&local_dd1);
  bVar1 = argh::parser::operator[]((parser *)local_100,(string *)local_dd0);
  std::__cxx11::string::~string(local_dd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd1);
  if (bVar1) {
    this->do_l2 = 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_df8,"v",&local_df9);
  bVar1 = argh::parser::operator[]((parser *)local_100,(string *)local_df8);
  std::__cxx11::string::~string(local_df8);
  std::allocator<char>::~allocator((allocator<char> *)&local_df9);
  if (bVar1) {
    this->do_invert = 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e20,"f",&local_e21);
  bVar1 = argh::parser::operator[]((parser *)local_100,(string *)local_e20);
  std::__cxx11::string::~string(local_e20);
  std::allocator<char>::~allocator((allocator<char> *)&local_e21);
  if (bVar1) {
    this->use_newformat = '\0';
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fc8,"m",&local_fc9);
  argh::parser::operator()(&local_fa8,(parser *)local_100,(string *)local_fc8);
  bVar1 = argh::stringstream_proxy::operator_cast_to_bool(&local_fa8);
  argh::stringstream_proxy::~stringstream_proxy(&local_fa8);
  std::__cxx11::string::~string(local_fc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fc9);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1170,"m",&local_1171);
    argh::parser::operator()(&local_1150,(parser *)local_100,(string *)local_1170);
    argh::stringstream_proxy::operator>>(&local_1150,&this->AMEM);
    argh::stringstream_proxy::~stringstream_proxy(&local_1150);
    std::__cxx11::string::~string(local_1170);
    std::allocator<char>::~allocator((allocator<char> *)&local_1171);
    this->AMEM = this->AMEM * 0x12d000;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1198,"x",&local_1199);
  bVar1 = argh::parser::operator[]((parser *)local_100,(string *)local_1198);
  std::__cxx11::string::~string(local_1198);
  std::allocator<char>::~allocator((allocator<char> *)&local_1199);
  if (bVar1) {
    this->no_minus_off = '\x01';
  }
  std::ifstream::ifstream(&local_13a8,(string *)&this->inconfn,_S_bin);
  bVar2 = std::ios::operator!((ios *)((long)&local_13a8 + *(long *)(local_13a8 + -0x18)));
  if ((bVar2 & 1) != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_13c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "ERROR: Can\'t read conf file: ");
    std::runtime_error::runtime_error(prVar3,local_13c8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->use_seq == 0) {
    std::istream::read((char *)&local_13a8,(long)&this->DBASE_NUM_TRANS);
    std::istream::read((char *)&local_13a8,(long)&this->DBASE_MAXITEM);
    std::istream::read((char *)&local_13a8,(long)&this->DBASE_AVG_TRANS_SZ);
  }
  else {
    std::istream::read((char *)&local_13a8,(long)&this->DBASE_NUM_TRANS);
    std::istream::read((char *)&local_13a8,(long)&this->DBASE_MAXITEM);
    std::istream::read((char *)&local_13a8,(long)&this->DBASE_AVG_CUST_SZ);
    std::istream::read((char *)&local_13a8,(long)&this->DBASE_AVG_TRANS_SZ);
    std::istream::read((char *)&local_13a8,(long)&this->DBASE_TOT_TRANS);
  }
  if (this->use_diff != '\0') {
    this->use_seq = 0;
    this->num_partitions = 1;
  }
  if (this->use_seq != 0) {
    this->write_only_fcnt = 0;
  }
  std::ifstream::~ifstream(&local_13a8);
  argh::parser::~parser((parser *)local_100);
  return;
}

Assistant:

void parse_args(int argc, char **argv) {
        auto cmdl = argh::parser(argc, argv, argh::parser::PREFER_PARAM_FOR_UNREG_OPTION);
        if (!cmdl({"s", "i", "o"})) {
            cerr << "usage: exttpose [OPTION]... -i<infile> -o<outfile> -s\n";
            throw runtime_error("exttpose needs valid value of -i -o and -s");
        }
        cmdl("i") >> name;
        input = name + ".data";
        inconfn = name + ".conf";
        cmdl("o") >> name;
        output = name + ".tpose";
        idxfn = name + ".idx";
        it2fn = name + ".2it";
        seqfn = name + ".2seq";
        tmpfn = name + ".tmp";
        cmdl("p") >> num_partitions;
        cmdl("s") >> MINSUP_PER;
        if (cmdl("a")) {
            use_seq = 0;
            cmdl("a") >> write_only_fcnt;
        }
        if (cmdl["d"]) use_diff = 1;
        if (cmdl["l"]) do_l2 = 0;
        if (cmdl["v"]) do_invert = 0;
        if (cmdl["f"]) use_newformat = 0;
        if (cmdl("m")) {
            cmdl("m") >> AMEM;
            AMEM *= MEG;
        }
        if (cmdl["x"]) no_minus_off = 1;

        ifstream inconff(inconfn, ios::binary);
        if (!inconff) {
            throw runtime_error("ERROR: Can\'t read conf file: " + inconfn);
        }

        if (use_seq) {
            inconff.read((char *) &DBASE_NUM_TRANS, INT_SIZE);
            inconff.read((char *) &DBASE_MAXITEM, INT_SIZE);
            inconff.read((char *) &DBASE_AVG_CUST_SZ, sizeof(float));
            inconff.read((char *) &DBASE_AVG_TRANS_SZ, sizeof(float));
            inconff.read((char *) &DBASE_TOT_TRANS, INT_SIZE);
        } else {
            inconff.read((char *) &DBASE_NUM_TRANS, INT_SIZE);
            inconff.read((char *) &DBASE_MAXITEM, INT_SIZE);
            inconff.read((char *) &DBASE_AVG_TRANS_SZ, sizeof(float));
        }

        if (use_diff) {
            use_seq = 0;
            num_partitions = 1;
        }
        if (use_seq) {
            write_only_fcnt = 0;
        }
    }